

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O2

int __thiscall Confparse::SaveDefault(Confparse *this,path *filepath)

{
  char cVar1;
  ofstream file;
  
  std::ofstream::ofstream(&file);
  std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (&file,filepath,_S_out|_S_bin|_S_ate);
  this->nested = true;
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::ostream::write((char *)&file,0x204910);
    std::ofstream::close();
    Load(this,filepath,false);
  }
  std::ofstream::~ofstream(&file);
  return (uint)(cVar1 == '\0');
}

Assistant:

int Confparse::SaveDefault(const filesystem::path &filepath) {
	ofstream file;
	file.open(filepath, std::ios::out | std::ios::binary | std::ios::ate);

	nested = true;
	if (file.is_open()) {
		file.write(default_conf, sizeof(default_conf) - 1);
		file.close();
		Load(filepath);

		return 0;
	} else {
		return 1;
	}
}